

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O3

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  stbi_uc *psVar1;
  int iVar2;
  stbi__context s;
  stbi__context sStack_f8;
  
  sStack_f8.io.eof = c->eof;
  psVar1 = sStack_f8.buffer_start;
  sStack_f8.io.read._0_4_ = *(undefined4 *)&c->read;
  sStack_f8.io.read._4_4_ = *(undefined4 *)((long)&c->read + 4);
  sStack_f8.io.skip._0_4_ = *(undefined4 *)&c->skip;
  sStack_f8.io.skip._4_4_ = *(undefined4 *)((long)&c->skip + 4);
  sStack_f8.read_from_callbacks = 1;
  sStack_f8.buflen = 0x80;
  sStack_f8.io_user_data = user;
  sStack_f8.img_buffer_original = psVar1;
  iVar2 = (*c->read)(user,(char *)psVar1,0x80);
  if (iVar2 == 0) {
    sStack_f8.img_buffer_end = sStack_f8.buffer_start + 1;
    sStack_f8._48_8_ = sStack_f8._48_8_ & 0xffffffff00000000;
    sStack_f8.buffer_start[0] = '\0';
  }
  else {
    sStack_f8.img_buffer_end = psVar1 + iVar2;
  }
  sStack_f8.img_buffer = psVar1;
  sStack_f8.img_buffer_original_end = sStack_f8.img_buffer_end;
  iVar2 = stbi__info_main(&sStack_f8,x,y,comp);
  return iVar2;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__info_main(&s,x,y,comp);
}